

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O1

ShaderProgramDeclaration *
deqp::gls::ContextShaderProgram::createProgramDeclaration
          (ShaderProgramDeclaration *__return_storage_ptr__,RenderContext *ctx,
          vector<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_> *arrays)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ContextShaderProgram *this;
  uint uVar3;
  undefined8 *puVar4;
  vector<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_> *in_RCX;
  RenderContext *extraout_RDX;
  RenderContext *extraout_RDX_00;
  RenderContext *extraout_RDX_01;
  RenderContext *ctx_00;
  GenericVecType GVar5;
  long lVar6;
  ContextArray *pCVar7;
  VertexAttribute local_238;
  vector<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_> *local_210;
  long local_208;
  vector<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_> local_200;
  long local_1e8;
  ContextArray *local_1e0 [2];
  ContextArray **local_1d0;
  long local_1c8;
  ContextArray *local_1c0 [2];
  ContextShaderProgram *local_1b0;
  Uniform local_1a8 [2];
  ios_base local_138 [264];
  
  local_1b0 = (ContextShaderProgram *)ctx;
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration(__return_storage_ptr__);
  if (0 < (int)((ulong)((long)(arrays->
                              super__Vector_base<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(arrays->
                             super__Vector_base<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_>
                             )._M_impl.super__Vector_impl_data._M_start) >> 3)) {
    lVar6 = 0;
    do {
      local_1d0 = local_1c0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"a_","");
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::ostream::operator<<(local_1a8,(int)lVar6);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      pCVar7 = (ContextArray *)0xf;
      if (local_1d0 != local_1c0) {
        pCVar7 = local_1c0[0];
      }
      if (pCVar7 < (ContextArray *)(local_1e8 + local_1c8)) {
        pCVar7 = (ContextArray *)0xf;
        if (local_200.
            super__Vector_base<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage != local_1e0) {
          pCVar7 = local_1e0[0];
        }
        if (pCVar7 < (ContextArray *)(local_1e8 + local_1c8)) goto LAB_004ab72d;
        puVar4 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_200.
                                    super__Vector_base<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,0,(char *)0x0
                            ,(ulong)local_1d0);
      }
      else {
LAB_004ab72d:
        puVar4 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_1d0,
                            (ulong)local_200.
                                   super__Vector_base<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      in_RCX = (vector<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_> *)
               (puVar4 + 2);
      if ((vector<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_> *)*puVar4
          == in_RCX) {
        local_200.
        super__Vector_base<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (in_RCX->
             super__Vector_base<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
        local_200.
        super__Vector_base<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_>.
        _M_impl.super__Vector_impl_data._M_finish._0_4_ = *(undefined4 *)(puVar4 + 3);
        local_200.
        super__Vector_base<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_>.
        _M_impl.super__Vector_impl_data._M_finish._4_4_ = *(undefined4 *)((long)puVar4 + 0x1c);
        local_210 = &local_200;
      }
      else {
        local_200.
        super__Vector_base<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (in_RCX->
             super__Vector_base<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
        local_210 = (vector<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_> *
                    )*puVar4;
      }
      local_208 = puVar4[1];
      *puVar4 = in_RCX;
      puVar4[1] = 0;
      *(undefined1 *)
       &(in_RCX->
        super__Vector_base<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_>).
        _M_impl.super__Vector_impl_data._M_start = 0;
      uVar3 = (*((arrays->
                 super__Vector_base<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_>
                 )._M_impl.super__Vector_impl_data._M_start[lVar6]->super_Array)._vptr_Array[10])();
      GVar5 = GENERICVECTYPE_LAST;
      if (uVar3 < 0xc) {
        in_RCX = (vector<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_> *)
                 &DAT_006854fc;
        GVar5 = *(GenericVecType *)(&DAT_006854fc + (ulong)uVar3 * 4);
      }
      local_238.name._M_dataplus._M_p = (pointer)&local_238.name.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_238,local_210,
                 (undefined *)
                 ((long)&(local_210->
                         super__Vector_base<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_>
                         )._M_impl.super__Vector_impl_data._M_start + local_208));
      local_238.type = GVar5;
      sglr::pdec::ShaderProgramDeclaration::operator<<(__return_storage_ptr__,&local_238);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238.name._M_dataplus._M_p != &local_238.name.field_2) {
        operator_delete(local_238.name._M_dataplus._M_p,
                        local_238.name.field_2._M_allocated_capacity + 1);
      }
      if (local_210 != &local_200) {
        operator_delete(local_210,
                        (long)local_200.
                              super__Vector_base<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_>
                              ._M_impl.super__Vector_impl_data._M_start + 1);
      }
      if (local_200.
          super__Vector_base<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage != local_1e0) {
        operator_delete(local_200.
                        super__Vector_base<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                        (ulong)((long)&(local_1e0[0]->super_Array)._vptr_Array + 1));
      }
      if (local_1d0 != local_1c0) {
        operator_delete(local_1d0,(ulong)((long)&(local_1c0[0]->super_Array)._vptr_Array + 1));
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < (int)((ulong)((long)(arrays->
                                         super__Vector_base<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_>
                                         )._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(arrays->
                                        super__Vector_base<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_>
                                        )._M_impl.super__Vector_impl_data._M_start) >> 3));
  }
  local_1a8[0].name._M_dataplus._M_p =
       (pointer)((ulong)local_1a8[0].name._M_dataplus._M_p._5_3_ << 0x28);
  sglr::pdec::ShaderProgramDeclaration::operator<<
            (__return_storage_ptr__,(VertexToFragmentVarying *)local_1a8);
  local_1a8[0].name._M_dataplus._M_p = local_1a8[0].name._M_dataplus._M_p & 0xffffffff00000000;
  sglr::pdec::ShaderProgramDeclaration::operator<<
            (__return_storage_ptr__,(FragmentOutput *)local_1a8);
  this = local_1b0;
  genVertexSource_abi_cxx11_(&local_238.name,local_1b0,(RenderContext *)arrays,in_RCX);
  paVar2 = &local_1a8[0].name.field_2;
  local_1a8[0].name._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1a8,local_238.name._M_dataplus._M_p,
             local_238.name._M_dataplus._M_p + local_238.name._M_string_length);
  sglr::pdec::ShaderProgramDeclaration::operator<<(__return_storage_ptr__,(VertexSource *)local_1a8)
  ;
  ctx_00 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0].name._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a8[0].name._M_dataplus._M_p,
                    local_1a8[0].name.field_2._M_allocated_capacity + 1);
    ctx_00 = extraout_RDX_00;
  }
  paVar1 = &local_238.name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_238.name._M_dataplus._M_p,local_238.name.field_2._M_allocated_capacity + 1
                   );
    ctx_00 = extraout_RDX_01;
  }
  genFragmentSource_abi_cxx11_(&local_238.name,this,ctx_00);
  local_1a8[0].name._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1a8,local_238.name._M_dataplus._M_p,
             local_238.name._M_dataplus._M_p + local_238.name._M_string_length);
  sglr::pdec::ShaderProgramDeclaration::operator<<
            (__return_storage_ptr__,(FragmentSource *)local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0].name._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a8[0].name._M_dataplus._M_p,
                    local_1a8[0].name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_238.name._M_dataplus._M_p,local_238.name.field_2._M_allocated_capacity + 1
                   );
  }
  local_238.name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"u_coordScale","");
  local_1a8[0].name._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1a8,local_238.name._M_dataplus._M_p,
             local_238.name._M_dataplus._M_p + local_238.name._M_string_length);
  local_1a8[0].type = TYPE_FLOAT;
  sglr::pdec::ShaderProgramDeclaration::operator<<(__return_storage_ptr__,local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0].name._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a8[0].name._M_dataplus._M_p,
                    local_1a8[0].name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_238.name._M_dataplus._M_p,local_238.name.field_2._M_allocated_capacity + 1
                   );
  }
  local_238.name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"u_colorScale","");
  local_1a8[0].name._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1a8,local_238.name._M_dataplus._M_p,
             local_238.name._M_dataplus._M_p + local_238.name._M_string_length);
  local_1a8[0].type = TYPE_FLOAT;
  sglr::pdec::ShaderProgramDeclaration::operator<<(__return_storage_ptr__,local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0].name._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a8[0].name._M_dataplus._M_p,
                    local_1a8[0].name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_238.name._M_dataplus._M_p,local_238.name.field_2._M_allocated_capacity + 1
                   );
  }
  return __return_storage_ptr__;
}

Assistant:

sglr::pdec::ShaderProgramDeclaration ContextShaderProgram::createProgramDeclaration (const glu::RenderContext& ctx, const std::vector<ContextArray*>& arrays)
{
	sglr::pdec::ShaderProgramDeclaration decl;

	for (int arrayNdx = 0; arrayNdx < (int)arrays.size(); arrayNdx++)
		decl << sglr::pdec::VertexAttribute(std::string("a_") + de::toString(arrayNdx), mapOutputType(arrays[arrayNdx]->getOutputType()));

	decl << sglr::pdec::VertexToFragmentVarying(rr::GENERICVECTYPE_FLOAT);
	decl << sglr::pdec::FragmentOutput(rr::GENERICVECTYPE_FLOAT);

	decl << sglr::pdec::VertexSource(genVertexSource(ctx, arrays));
	decl << sglr::pdec::FragmentSource(genFragmentSource(ctx));

	decl << sglr::pdec::Uniform("u_coordScale", glu::TYPE_FLOAT);
	decl << sglr::pdec::Uniform("u_colorScale", glu::TYPE_FLOAT);

	return decl;
}